

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>::do_line
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this,
          sample_type *param_1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  sample_type sVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  uint start_index;
  int qs;
  uint rc;
  uint rb;
  
  uVar4 = (uint)*this->previous_line_;
  rc = (uint)this->previous_line_[-1];
  start_index = 0;
  while (rb = uVar4, start_index < this->width_) {
    uVar1 = this->current_line_[(long)(int)start_index + -1];
    uVar2 = this->previous_line_[(long)(int)start_index + 1];
    iVar6 = quantize_gradient(this,uVar2 - rb);
    iVar7 = quantize_gradient(this,rb - rc);
    iVar8 = quantize_gradient(this,rc - uVar1);
    qs = (iVar6 * 9 + iVar7) * 9 + iVar8;
    if (qs == 0) {
      iVar6 = do_run_mode(this,start_index,(decoder_strategy *)0x0);
      start_index = start_index + iVar6;
      rc = (uint)this->previous_line_[(long)(int)start_index + -1];
      uVar4 = (uint)this->previous_line_[(int)start_index];
    }
    else {
      uVar3 = this->current_line_[(int)start_index];
      iVar6 = get_predicted_value((uint)uVar1,rb,rc);
      sVar5 = do_regular(this,qs,(uint)uVar3,iVar6,(decoder_strategy *)0x0);
      this->current_line_[(int)start_index] = sVar5;
      uVar4 = (uint)uVar2;
      rc = rb;
      start_index = start_index + 1;
    }
  }
  return;
}

Assistant:

FORCE_INLINE void do_line(sample_type* /*template_selector*/)
    {
        int32_t index{};
        int32_t rb{previous_line_[index - 1]};
        int32_t rd{previous_line_[index]};

        while (static_cast<uint32_t>(index) < width_)
        {
            const int32_t ra{current_line_[index - 1]};
            const int32_t rc{rb};
            rb = rd;
            rd = previous_line_[index + 1];

            const int32_t qs{
                compute_context_id(quantize_gradient(rd - rb), quantize_gradient(rb - rc), quantize_gradient(rc - ra))};

            if (qs != 0)
            {
                current_line_[index] =
                    do_regular(qs, current_line_[index], get_predicted_value(ra, rb, rc), static_cast<Strategy*>(nullptr));
                ++index;
            }
            else
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
                rb = previous_line_[index - 1];
                rd = previous_line_[index];
            }
        }
    }